

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExtractSHRT.cpp
# Opt level: O3

void anon_unknown.dwarf_52167::testMatrix(M33f *M)

{
  float fVar1;
  bool bVar2;
  ostream *poVar3;
  long lVar4;
  float (*v) [3];
  long lVar5;
  float r;
  float h;
  M33f N;
  float local_b8;
  float local_b4;
  Vec2<float> local_b0;
  undefined1 local_a8 [16];
  Vec2<float> local_90;
  Matrix33<float> local_88;
  Matrix33<float> local_58;
  
  lVar5 = 0;
  local_b0.x = 0.0;
  local_b0.y = 0.0;
  local_90.x = 0.0;
  local_90.y = 0.0;
  local_b8 = 0.0;
  bVar2 = Imath_2_5::extractSHRT<float>(M,&local_b0,&local_b4,&local_b8,&local_90,true);
  if (!bVar2) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Unable to extractSHRT");
    std::endl<char,std::char_traits<char>>(poVar3);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testExtractSHRT.cpp"
                  ,0x4f,"void (anonymous namespace)::testMatrix(const M33f)");
  }
  local_58.x[1][2] = 0.0;
  local_58.x[2][0] = 0.0;
  local_58.x[2][1] = 0.0;
  local_58.x[0][1] = 0.0;
  local_58.x[0][2] = 0.0;
  local_58.x[1][0] = 0.0;
  local_58.x[0][0] = 1.0;
  local_58.x[1][1] = 1.0;
  local_58.x[2][2] = 1.0;
  local_88.x[1][2] = 0.0;
  local_88.x[2][0] = 0.0;
  local_88.x[2][1] = 0.0;
  local_88.x[0][1] = 0.0;
  local_88.x[0][2] = 0.0;
  local_88.x[1][0] = 0.0;
  local_88.x[0][0] = local_b0.x;
  local_88.x[1][1] = local_b0.y;
  local_88.x[2][2] = 1.0;
  Imath_2_5::Matrix33<float>::operator*=(&local_58,&local_88);
  local_88.x[0][0] = 1.0;
  local_88.x[0][1] = 0.0;
  local_88.x[0][2] = 0.0;
  local_88.x[1][0] = local_b4;
  local_88.x[1][1] = 1.0;
  local_88.x[1][2] = 0.0;
  local_88.x[2][0] = 0.0;
  local_88.x[2][1] = 0.0;
  local_88.x[2][2] = 1.0;
  Imath_2_5::Matrix33<float>::operator*=(&local_58,&local_88);
  fVar1 = local_b8;
  local_a8._0_4_ = cosf(local_b8);
  local_88.x[0][1] = sinf(fVar1);
  local_88.x[0][0] = (float)local_a8._0_4_;
  local_88.x[0][2] = 0.0;
  local_88.x[1][0] = -local_88.x[0][1];
  local_88.x[1][1] = (float)local_a8._0_4_;
  local_88.x[1][2] = 0.0;
  local_88.x[2][0] = 0.0;
  local_88.x[2][1] = 0.0;
  local_88.x[2][2] = 1.0;
  Imath_2_5::Matrix33<float>::operator*=(&local_58,&local_88);
  local_88.x[0][0] = 1.0;
  local_88.x[0][1] = 0.0;
  local_88.x[0][2] = 0.0;
  local_88.x[1][0] = 0.0;
  local_88.x[2][0] = local_90.x;
  local_88.x[2][1] = local_90.y;
  local_88.x[1][1] = 1.0;
  local_88.x[1][2] = 0.0;
  local_88.x[2][2] = 1.0;
  v = (float (*) [3])&local_88;
  Imath_2_5::Matrix33<float>::operator*=(&local_58,(Matrix33<float> *)v);
  local_88.x[0][0] = M->x[0][0] - local_58.x[0][0];
  local_88.x[0][1] = M->x[0][1] - local_58.x[0][1];
  local_88.x[0][2] = M->x[0][2] - local_58.x[0][2];
  local_88.x[1][0] = M->x[1][0] - local_58.x[1][0];
  local_88.x[1][1] = M->x[1][1] - local_58.x[1][1];
  local_88.x[1][2] = M->x[1][2] - local_58.x[1][2];
  local_88.x[2][0] = M->x[2][0] - local_58.x[2][0];
  local_88.x[2][1] = M->x[2][1] - local_58.x[2][1];
  local_88.x[2][2] = M->x[2][2] - local_58.x[2][2];
  do {
    lVar4 = 0;
    do {
      fVar1 = (*(float (*) [3])*v)[lVar4];
      if (1e-05 < ABS(fVar1)) {
        local_a8 = ZEXT416((uint)fVar1);
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "unexpectedly large matrix to euler angles conversion error: ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,(float)local_a8._0_4_);
        std::endl<char,std::char_traits<char>>(poVar3);
        poVar3 = (ostream *)std::ostream::operator<<(&std::cout,(int)lVar5);
        poVar3 = std::operator<<(poVar3," ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)lVar4);
        std::endl<char,std::char_traits<char>>(poVar3);
        poVar3 = std::operator<<((ostream *)&std::cout,"M\n");
        poVar3 = Imath_2_5::operator<<(poVar3,M);
        std::endl<char,std::char_traits<char>>(poVar3);
        poVar3 = std::operator<<((ostream *)&std::cout,"N\n");
        poVar3 = Imath_2_5::operator<<(poVar3,&local_58);
        std::endl<char,std::char_traits<char>>(poVar3);
        poVar3 = std::operator<<((ostream *)&std::cout,"D\n");
        poVar3 = Imath_2_5::operator<<(poVar3,&local_88);
        std::endl<char,std::char_traits<char>>(poVar3);
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testExtractSHRT.cpp"
                      ,0x75,"void (anonymous namespace)::testMatrix(const M33f)");
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    lVar5 = lVar5 + 1;
    v = v + 1;
  } while (lVar5 != 3);
  return;
}

Assistant:

void
testMatrix (const M33f M)
{
    //
    // Extract the rotation angle from M, and convert the
    // angle back to a matrix, N.
    //

    V2f s(0.f), t(0.f);
    float h, r= 0.f;
  
    if (!extractSHRT (M, s, h, r, t, true))
    {
        cout << "Unable to extractSHRT" << std::endl;
        assert(false);
    }

    M33f N;

    N *= M33f().setScale (s);
    N *= M33f().setShear (h);
    N *= M33f().setRotation (r);
    N *= M33f().setTranslation (t);

    debug (("Re-scale: %f %f\n", s[0], s[1]));
    debug (("Re-shear: %f\n", h));
    debug (("Re-rot  : %f\n", r));
    debug (("Re-trans: %f %f\n", t[0], t[1]));

    //
    // Verify that the entries in M and N do not
    // differ too much.
    //

    M33f D (M - N);

    for (int j = 0; j < 3; ++j)
    {
	for (int k = 0; k < 3; ++k)
	{
	    if (abs (D[j][k]) > 0.00001)
	    {
		cout << "unexpectedly large matrix to "
			"euler angles conversion error: " <<
			D[j][k] << endl;

		cout << j << " " << k << endl;

		cout << "M\n" << M << endl;
		cout << "N\n" << N << endl;
		cout << "D\n" << D << endl;

		assert (false);
	    }
	}
    }
}